

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintWriter.cpp
# Opt level: O0

void __thiscall
OpenMD::ConstraintWriter::writeConstraintForces
          (ConstraintWriter *this,
          list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *constraints)

{
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  SnapshotManager *this_00;
  Snapshot *this_01;
  ostream *poVar4;
  void *this_02;
  undefined8 *in_RDI;
  RealType RVar5;
  const_iterator i;
  list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
  *in_stack_ffffffffffffffa8;
  _List_const_iterator<OpenMD::ConstraintPair_*> *in_stack_ffffffffffffffb0;
  _Self local_28;
  _List_node_base *local_20;
  _List_const_iterator<OpenMD::ConstraintPair_*> local_18 [3];
  
  std::_List_const_iterator<OpenMD::ConstraintPair_*>::_List_const_iterator(local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
             ::begin(in_stack_ffffffffffffffa8);
  local_18[0]._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::
         end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(local_18,&local_28);
    if (!bVar1) break;
    ppCVar3 = std::_List_const_iterator<OpenMD::ConstraintPair_*>::operator*
                        (in_stack_ffffffffffffffb0);
    bVar1 = ConstraintPair::getPrintForce(*ppCVar3);
    if (bVar1) {
      in_stack_ffffffffffffffb0 = (_List_const_iterator<OpenMD::ConstraintPair_*> *)(in_RDI + 1);
      this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
      this_01 = SnapshotManager::getCurrentSnapshot(this_00);
      RVar5 = Snapshot::getTime(this_01);
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffb0,RVar5);
      poVar4 = std::operator<<(poVar4,"\t");
      ppCVar3 = std::_List_const_iterator<OpenMD::ConstraintPair_*>::operator*
                          (in_stack_ffffffffffffffb0);
      ConstraintPair::getConsElem1(*ppCVar3);
      iVar2 = ConstraintElem::getGlobalIndex((ConstraintElem *)0x35f83e);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"\t");
      ppCVar3 = std::_List_const_iterator<OpenMD::ConstraintPair_*>::operator*
                          (in_stack_ffffffffffffffb0);
      ConstraintPair::getConsElem2(*ppCVar3);
      iVar2 = ConstraintElem::getGlobalIndex((ConstraintElem *)0x35f878);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"\t");
      ppCVar3 = std::_List_const_iterator<OpenMD::ConstraintPair_*>::operator*
                          (in_stack_ffffffffffffffb0);
      RVar5 = ConstraintPair::getConstraintForce(*ppCVar3);
      this_02 = (void *)std::ostream::operator<<(poVar4,RVar5);
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    }
    std::_List_const_iterator<OpenMD::ConstraintPair_*>::operator++(local_18);
  }
  return;
}

Assistant:

void ConstraintWriter::writeConstraintForces(
      const std::list<ConstraintPair*>& constraints) {
#ifndef IS_MPI
    std::list<ConstraintPair*>::const_iterator i;
    for (i = constraints.begin(); i != constraints.end(); ++i) {
      if ((*i)->getPrintForce()) {
        output_ << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
                << "\t" << (*i)->getConsElem1()->getGlobalIndex() << "\t"
                << (*i)->getConsElem2()->getGlobalIndex() << "\t"
                << (*i)->getConstraintForce() << std::endl;
      }
    }
#else

    const int primaryNode = 0;
    int nproc;
    int myNode;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);
    MPI_Comm_rank(MPI_COMM_WORLD, &myNode);

    std::vector<int> nConstraints(nproc, 0);
    nConstraints[myNode] = constraints.size();

    // do MPI_ALLREDUCE to exchange the total number of constraints:
    MPI_Allreduce(MPI_IN_PLACE, &nConstraints[0], nproc, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    MPI_Status ierr;
    int atom1, atom2, doPrint;
    RealType force;

    if (myNode == primaryNode) {
      std::vector<ConstraintData> constraintData;
      ConstraintData tmpData;
      for (int i = 0; i < nproc; ++i) {
        if (i == primaryNode) {
          std::list<ConstraintPair*>::const_iterator j;
          for (j = constraints.begin(); j != constraints.end(); ++j) {
            tmpData.atom1           = (*j)->getConsElem1()->getGlobalIndex();
            tmpData.atom2           = (*j)->getConsElem2()->getGlobalIndex();
            tmpData.constraintForce = (*j)->getConstraintForce();
            tmpData.printForce      = (*j)->getPrintForce();
            constraintData.push_back(tmpData);
          }

        } else {
          for (int k = 0; k < nConstraints[i]; ++k) {
            MPI_Recv(&atom1, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&atom2, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&force, 1, MPI_REALTYPE, i, 0, MPI_COMM_WORLD, &ierr);
            MPI_Recv(&doPrint, 1, MPI_INT, i, 0, MPI_COMM_WORLD, &ierr);

            tmpData.atom1           = atom1;
            tmpData.atom2           = atom2;
            tmpData.constraintForce = force;
            tmpData.printForce      = (doPrint == 0) ? false : true;
            constraintData.push_back(tmpData);
          }
        }
      }

      std::vector<ConstraintData>::iterator l;
      for (l = constraintData.begin(); l != constraintData.end(); ++l) {
        if (l->printForce) {
          output_
              << info_->getSnapshotManager()->getCurrentSnapshot()->getTime()
              << "\t" << l->atom1 << "\t" << l->atom2 << "\t"
              << l->constraintForce << std::endl;
        }
      }
    } else {
      std::list<ConstraintPair*>::const_iterator j;
      for (j = constraints.begin(); j != constraints.end(); ++j) {
        int atom1                = (*j)->getConsElem1()->getGlobalIndex();
        int atom2                = (*j)->getConsElem2()->getGlobalIndex();
        RealType constraintForce = (*j)->getConstraintForce();
        int printForce           = (int)(*j)->getPrintForce();

        MPI_Send(&atom1, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(&atom2, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
        MPI_Send(&constraintForce, 1, MPI_REALTYPE, primaryNode, 0,
                 MPI_COMM_WORLD);
        MPI_Send(&printForce, 1, MPI_INT, primaryNode, 0, MPI_COMM_WORLD);
      }
    }
#endif
  }